

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O3

int compute_all_sarb(uint8_t dst,uint8_t src1)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,dst);
  return (uint)(uVar1 == 0) << 6 | uVar1 & 0xffffff80 | ((src1 ^ uVar1) & 0x80) << 4 | src1 & 1 |
         (uint)"\x04"[CONCAT71(in_register_00000039,dst) & 0xffffffff];
}

Assistant:

static int glue(compute_all_sar, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;

    cf = src1 & 1;
    pf = parity_table[(uint8_t)dst];
    af = 0; /* undefined */
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    /* of is defined iff shift count == 1 */
    of = lshift(src1 ^ dst, 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}